

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void iterator_suite::test_push_alternating(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  reference piVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_d1;
  vector<int,_std::allocator<int>_> local_d0;
  circular_view<int,_18446744073709551615UL> local_b8;
  int local_98 [4];
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  type local_28 [6];
  
  local_b8.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_b8.member.cap = 4;
  local_b8.member.size = 0;
  local_b8.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar2 = 0xb;
  local_98[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_30 = local_b8.member.next % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = &local_b8;
  first_begin.current = uVar3;
  first_begin.parent = &local_b8;
  local_38 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x2fe,"void iterator_suite::test_push_alternating()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  *piVar2 = 0x16;
  local_98[0] = 0x16;
  local_98[1] = 0xb;
  __l_00._M_len = 2;
  __l_00._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_00,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_40 = local_b8.member.next % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = &local_b8;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_b8;
  local_48 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x304,"void iterator_suite::test_push_alternating()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar2 = 0x21;
  local_98[0] = 0x16;
  local_98[1] = 0xb;
  local_98[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_01,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_50 = local_b8.member.next % uVar1;
  }
  first_end_01.current = sStack_50;
  first_end_01.parent = &local_b8;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_b8;
  local_58 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x30a,"void iterator_suite::test_push_alternating()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  *piVar2 = 0x2c;
  local_98[0] = 0x2c;
  local_98[1] = 0x16;
  local_98[2] = 0xb;
  local_98[3] = 0x21;
  __l_02._M_len = 4;
  __l_02._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_02,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_60 = local_b8.member.next % uVar1;
  }
  first_end_02.current = sStack_60;
  first_end_02.parent = &local_b8;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_b8;
  local_68 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x310,"void iterator_suite::test_push_alternating()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_b8);
  *piVar2 = 0x37;
  local_98[0] = 0x16;
  local_98[1] = 0xb;
  local_98[2] = 0x21;
  local_98[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_03,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_70 = local_b8.member.next % uVar1;
  }
  first_end_03.current = sStack_70;
  first_end_03.parent = &local_b8;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_b8;
  local_78 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x316,"void iterator_suite::test_push_alternating()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_b8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_b8);
  *piVar2 = 0x42;
  local_98[0] = 0x42;
  local_98[1] = 0x16;
  local_98[2] = 0xb;
  local_98[3] = 0x21;
  __l_04._M_len = 4;
  __l_04._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_04,&local_d1);
  uVar1 = local_b8.member.cap * 2;
  if ((uVar1 & local_b8.member.cap * 2 - 1) == 0) {
    uVar3 = local_b8.member.next - local_b8.member.size & uVar1 - 1;
    sStack_80 = uVar1 - 1 & local_b8.member.next;
  }
  else {
    uVar3 = (local_b8.member.next - local_b8.member.size) % uVar1;
    sStack_80 = local_b8.member.next % uVar1;
  }
  first_end_04.current = sStack_80;
  first_end_04.parent = &local_b8;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_b8;
  local_88 = &local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x31c,"void iterator_suite::test_push_alternating()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_push_alternating()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(22);
    {
        std::vector<int> expect = { 22, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    {
        std::vector<int> expect = { 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(44);
    {
        std::vector<int> expect = { 44, 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(55);
    {
        std::vector<int> expect = { 22, 11, 33, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(66);
    {
        std::vector<int> expect = { 66, 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}